

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl.h
# Opt level: O3

void __thiscall
flatbuffers::SymbolTable<flatbuffers::StructDef>::~SymbolTable
          (SymbolTable<flatbuffers::StructDef> *this)

{
  StructDef *this_00;
  pointer ppSVar1;
  
  ppSVar1 = (this->vec).
            super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppSVar1 !=
      (this->vec).
      super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      this_00 = *ppSVar1;
      if (this_00 != (StructDef *)0x0) {
        StructDef::~StructDef(this_00);
      }
      operator_delete(this_00,0x148);
      ppSVar1 = ppSVar1 + 1;
    } while (ppSVar1 !=
             (this->vec).
             super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
    ppSVar1 = (this->vec).
              super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  if (ppSVar1 != (pointer)0x0) {
    operator_delete(ppSVar1,(long)(this->vec).
                                  super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppSVar1
                   );
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>_>
               *)this);
  return;
}

Assistant:

~SymbolTable() {
    for (auto it = vec.begin(); it != vec.end(); ++it) { delete *it; }
  }